

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O2

void ExportSkin(Asset *mAsset,aiMesh *aimesh,Ref<glTF::Mesh> *meshRef,Ref<glTF::Buffer> *bufferRef,
               Ref<glTF::Skin> *skinRef,
               vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
               *inverseBindMatricesData)

{
  float fVar1;
  aiBone *paVar2;
  Skin *pSVar3;
  pointer pPVar4;
  Ref<glTF::Buffer> *buffer;
  vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> *pvVar5;
  int iVar6;
  uint uVar7;
  void *pvVar8;
  void *pvVar9;
  ulong uVar10;
  void *pvVar11;
  ulong uVar12;
  long lVar13;
  ulong uVar14;
  bool bVar15;
  void *pvVar16;
  Ref<glTF::Node> RVar17;
  Ref<glTF::Accessor> RVar18;
  value_type local_c8;
  void *local_b8;
  void *local_b0;
  Ref<glTF::Mesh> *local_a8;
  Ref<glTF::Buffer> *local_a0;
  vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_> *local_98;
  LazyDict<glTF::Node> *local_90;
  void *local_88;
  ulong local_80;
  value_type local_78;
  
  uVar7 = aimesh->mNumBones;
  if (uVar7 != 0) {
    uVar10 = (ulong)aimesh->mNumVertices;
    local_a8 = meshRef;
    local_98 = inverseBindMatricesData;
    pvVar8 = operator_new__(uVar10 << 4);
    pvVar9 = operator_new__(uVar10 << 4);
    local_b8 = operator_new__(uVar10 * 4);
    pvVar11 = pvVar8;
    pvVar16 = pvVar9;
    for (uVar14 = 0; uVar14 != uVar10; uVar14 = uVar14 + 1) {
      *(undefined4 *)((long)local_b8 + uVar14 * 4) = 0;
      for (lVar13 = 0; lVar13 != 4; lVar13 = lVar13 + 1) {
        *(undefined4 *)((long)pvVar11 + lVar13 * 4) = 0;
        *(undefined4 *)((long)pvVar16 + lVar13 * 4) = 0;
      }
      pvVar11 = (void *)((long)pvVar11 + 0x10);
      pvVar16 = (void *)((long)pvVar16 + 0x10);
    }
    local_90 = &mAsset->nodes;
    uVar10 = 0;
    local_b0 = pvVar9;
    local_a0 = bufferRef;
    local_88 = pvVar8;
    while (pvVar16 = local_88, buffer = local_a0, pvVar11 = local_b0, uVar10 < uVar7) {
      paVar2 = aimesh->mBones[uVar10];
      local_80 = uVar10;
      RVar17 = glTF::LazyDict<glTF::Node>::Get(local_90,(paVar2->mName).data);
      local_c8.vector = (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)RVar17.vector
      ;
      local_c8.index = RVar17.index;
      std::__cxx11::string::_M_assign
                ((string *)
                 &(((_Vector_base<glTF::Node_*,_std::allocator<glTF::Node_*>_> *)
                   &(local_c8.vector)->
                    super__Vector_base<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_>)->
                  _M_impl).super__Vector_impl_data._M_start[local_c8.index]->jointName);
      bVar15 = true;
      uVar7 = 0;
      uVar10 = 0;
      while( true ) {
        uVar14 = (ulong)uVar7;
        pSVar3 = (skinRef->vector->super__Vector_base<glTF::Skin_*,_std::allocator<glTF::Skin_*>_>).
                 _M_impl.super__Vector_impl_data._M_start[skinRef->index];
        lVar13 = *(long *)&(pSVar3->jointNames).
                           super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>
                           ._M_impl;
        if ((ulong)((long)*(pointer *)
                           ((long)&(pSVar3->jointNames).
                                   super__Vector_base<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>
                           + 8) - lVar13 >> 4) <= uVar14) break;
        iVar6 = std::__cxx11::string::compare
                          ((string *)
                           (*(long *)(**(long **)(lVar13 + uVar14 * 0x10) +
                                     (ulong)*(uint *)(lVar13 + 8 + uVar14 * 0x10) * 8) + 0x138));
        if (iVar6 == 0) {
          uVar10 = uVar14;
        }
        bVar15 = (bool)(bVar15 & iVar6 != 0);
        uVar7 = uVar7 + 1;
      }
      if (bVar15) {
        std::vector<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>::push_back
                  (&pSVar3->jointNames,(value_type *)&local_c8);
        pvVar5 = local_98;
        local_78._0_8_ = *(undefined8 *)&paVar2->mOffsetMatrix;
        local_78.a3 = (paVar2->mOffsetMatrix).a3;
        local_78.a4 = (paVar2->mOffsetMatrix).a4;
        local_78.b1 = (paVar2->mOffsetMatrix).b1;
        local_78.b2 = (paVar2->mOffsetMatrix).b2;
        local_78.b3 = (paVar2->mOffsetMatrix).b3;
        local_78.b4 = (paVar2->mOffsetMatrix).b4;
        local_78.c1 = (paVar2->mOffsetMatrix).c1;
        local_78.c2 = (paVar2->mOffsetMatrix).c2;
        local_78.c3 = (paVar2->mOffsetMatrix).c3;
        local_78.c4 = (paVar2->mOffsetMatrix).c4;
        local_78.d1 = (paVar2->mOffsetMatrix).d1;
        local_78.d2 = (paVar2->mOffsetMatrix).d2;
        local_78.d3 = (paVar2->mOffsetMatrix).d3;
        local_78.d4 = (paVar2->mOffsetMatrix).d4;
        std::vector<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>::push_back
                  (local_98,&local_78);
        uVar10 = (ulong)((int)((ulong)((long)(pvVar5->
                                             super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                                             )._M_impl.super__Vector_impl_data._M_finish -
                                      (long)(pvVar5->
                                            super__Vector_base<aiMatrix4x4t<float>,_std::allocator<aiMatrix4x4t<float>_>_>
                                            )._M_impl.super__Vector_impl_data._M_start) >> 6) - 1);
      }
      uVar7 = paVar2->mNumWeights;
      for (uVar14 = 0; uVar14 < uVar7; uVar14 = uVar14 + 1) {
        uVar12 = (ulong)paVar2->mWeights[uVar14].mVertexId;
        iVar6 = *(int *)((long)local_b8 + uVar12 * 4);
        lVar13 = (long)iVar6;
        if (lVar13 < 4) {
          fVar1 = paVar2->mWeights[uVar14].mWeight;
          *(float *)((long)local_88 + lVar13 * 4 + uVar12 * 0x10) = (float)uVar10;
          *(float *)((long)local_b0 + lVar13 * 4 + uVar12 * 0x10) = fVar1;
          *(int *)((long)local_b8 + uVar12 * 4) = iVar6 + 1;
        }
      }
      uVar7 = aimesh->mNumBones;
      uVar10 = local_80 + 1;
    }
    pPVar4 = *(pointer *)
              ((long)&((local_a8->vector->
                       super__Vector_base<glTF::Mesh_*,_std::allocator<glTF::Mesh_*>_>)._M_impl.
                       super__Vector_impl_data._M_start[local_a8->index]->primitives).
                      super__Vector_base<glTF::Mesh::Primitive,_std::allocator<glTF::Mesh::Primitive>_>
              + 8);
    RVar18 = ExportData(mAsset,&((skinRef->vector->
                                 super__Vector_base<glTF::Skin_*,_std::allocator<glTF::Skin_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start[skinRef->index]->
                                super_Object).id,local_a0,aimesh->mNumVertices,local_88,VEC4,VEC4,
                        ComponentType_FLOAT,false);
    local_78._0_8_ = RVar18.vector;
    local_78.a3 = (float)RVar18.index;
    if ((vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)local_78._0_8_ !=
        (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0) {
      std::vector<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>::push_back
                (&pPVar4[-1].attributes.joint,(value_type *)&local_78);
    }
    RVar18 = ExportData(mAsset,&((skinRef->vector->
                                 super__Vector_base<glTF::Skin_*,_std::allocator<glTF::Skin_*>_>).
                                 _M_impl.super__Vector_impl_data._M_start[skinRef->index]->
                                super_Object).id,buffer,aimesh->mNumVertices,pvVar11,VEC4,VEC4,
                        ComponentType_FLOAT,false);
    local_c8.vector = RVar18.vector;
    local_c8.index = RVar18.index;
    if (local_c8.vector != (vector<glTF::Accessor_*,_std::allocator<glTF::Accessor_*>_> *)0x0) {
      std::vector<glTF::Ref<glTF::Accessor>,_std::allocator<glTF::Ref<glTF::Accessor>_>_>::push_back
                (&pPVar4[-1].attributes.weight,&local_c8);
    }
    operator_delete__(local_b8);
    operator_delete__(pvVar11);
    operator_delete__(pvVar16);
  }
  return;
}

Assistant:

void ExportSkin(Asset& mAsset, const aiMesh* aimesh, Ref<Mesh>& meshRef, Ref<Buffer>& bufferRef, Ref<Skin>& skinRef, std::vector<aiMatrix4x4>& inverseBindMatricesData)
{
    if (aimesh->mNumBones < 1) {
        return;
    }

    // Store the vertex joint and weight data.
    const size_t NumVerts( aimesh->mNumVertices );
    vec4* vertexJointData = new vec4[ NumVerts ];
    vec4* vertexWeightData = new vec4[ NumVerts ];
    int* jointsPerVertex = new int[ NumVerts ];
    for (size_t i = 0; i < NumVerts; ++i) {
        jointsPerVertex[i] = 0;
        for (size_t j = 0; j < 4; ++j) {
            vertexJointData[i][j] = 0;
            vertexWeightData[i][j] = 0;
        }
    }

    for (unsigned int idx_bone = 0; idx_bone < aimesh->mNumBones; ++idx_bone) {
        const aiBone* aib = aimesh->mBones[idx_bone];

        // aib->mName   =====>  skinRef->jointNames
        // Find the node with id = mName.
        Ref<Node> nodeRef = mAsset.nodes.Get(aib->mName.C_Str());
        nodeRef->jointName = nodeRef->id;

        unsigned int jointNamesIndex = 0;
        bool addJointToJointNames = true;
        for ( unsigned int idx_joint = 0; idx_joint < skinRef->jointNames.size(); ++idx_joint) {
            if (skinRef->jointNames[idx_joint]->jointName.compare(nodeRef->jointName) == 0) {
                addJointToJointNames = false;
                jointNamesIndex = idx_joint;
            }
        }

        if (addJointToJointNames) {
            skinRef->jointNames.push_back(nodeRef);

            // aib->mOffsetMatrix   =====>  skinRef->inverseBindMatrices
            aiMatrix4x4 tmpMatrix4;
            CopyValue(aib->mOffsetMatrix, tmpMatrix4);
            inverseBindMatricesData.push_back(tmpMatrix4);
            jointNamesIndex = static_cast<unsigned int>(inverseBindMatricesData.size() - 1);
        }

        // aib->mWeights   =====>  vertexWeightData
        for (unsigned int idx_weights = 0; idx_weights < aib->mNumWeights; ++idx_weights) {
            unsigned int vertexId = aib->mWeights[idx_weights].mVertexId;
            float vertWeight      = aib->mWeights[idx_weights].mWeight;

            // A vertex can only have at most four joint weights. Ignore all others.
            if (jointsPerVertex[vertexId] > 3) {
                continue;
            }

            vertexJointData[vertexId][jointsPerVertex[vertexId]] = static_cast<float>(jointNamesIndex);
            vertexWeightData[vertexId][jointsPerVertex[vertexId]] = vertWeight;

            jointsPerVertex[vertexId] += 1;
        }

    } // End: for-loop mNumMeshes

    Mesh::Primitive& p = meshRef->primitives.back();
    Ref<Accessor> vertexJointAccessor = ExportData(mAsset, skinRef->id, bufferRef, aimesh->mNumVertices, vertexJointData, AttribType::VEC4, AttribType::VEC4, ComponentType_FLOAT);
    if ( vertexJointAccessor ) {
        p.attributes.joint.push_back( vertexJointAccessor );
    }

    Ref<Accessor> vertexWeightAccessor = ExportData(mAsset, skinRef->id, bufferRef, aimesh->mNumVertices, vertexWeightData, AttribType::VEC4, AttribType::VEC4, ComponentType_FLOAT);
    if ( vertexWeightAccessor ) {
        p.attributes.weight.push_back( vertexWeightAccessor );
    }
    delete[] jointsPerVertex;
    delete[] vertexWeightData;
    delete[] vertexJointData;
}